

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall
CGraphics_Threaded::SetColor(CGraphics_Threaded *this,float r,float g,float b,float a)

{
  long *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  CColorVertex Array [4];
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  CColorVertex local_58;
  CColorVertex local_44;
  CColorVertex local_30;
  CColorVertex local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp((char *)in_RDI,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,(char *)0x12f969
                );
  IGraphics::CColorVertex::CColorVertex(&local_58,0,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
  IGraphics::CColorVertex::CColorVertex(&local_44,1,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
  IGraphics::CColorVertex::CColorVertex(&local_30,2,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
  IGraphics::CColorVertex::CColorVertex(&local_1c,3,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
  (**(code **)(*in_RDI + 0x100))(in_RDI,&local_58,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::SetColor(float r, float g, float b, float a)
{
	dbg_assert(m_Drawing != 0, "called Graphics()->SetColor without begin");
	CColorVertex Array[4] = {
		CColorVertex(0, r, g, b, a),
		CColorVertex(1, r, g, b, a),
		CColorVertex(2, r, g, b, a),
		CColorVertex(3, r, g, b, a)};
	SetColorVertex(Array, 4);
}